

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenIfSetCondition(BinaryenExpressionRef expr,BinaryenExpressionRef condExpr)

{
  if (expr->_id != IfId) {
    __assert_fail("expression->is<If>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x81c,"void BinaryenIfSetCondition(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (condExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = condExpr;
    return;
  }
  __assert_fail("condExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x81d,"void BinaryenIfSetCondition(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenIfSetCondition(BinaryenExpressionRef expr,
                            BinaryenExpressionRef condExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<If>());
  assert(condExpr);
  static_cast<If*>(expression)->condition = (Expression*)condExpr;
}